

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::set_dht_settings(session_impl *this,dht_settings *settings)

{
  session_settings *this_00;
  
  this_00 = &this->m_settings;
  session_settings::set_int(this_00,0x4089,settings->max_peers_reply);
  session_settings::set_int(this_00,0x408a,settings->search_branching);
  session_settings::set_int(this_00,0x408b,settings->max_fail_count);
  session_settings::set_int(this_00,0x408c,settings->max_torrents);
  session_settings::set_int(this_00,0x408d,settings->max_dht_items);
  session_settings::set_int(this_00,0x408e,settings->max_peers);
  session_settings::set_int(this_00,0x408f,settings->max_torrent_search_reply);
  session_settings::set_bool(this_00,0x8046,settings->restrict_routing_ips);
  session_settings::set_bool(this_00,0x8047,settings->restrict_search_ips);
  session_settings::set_bool(this_00,0x8048,settings->extended_routing_table);
  session_settings::set_bool(this_00,0x8049,settings->aggressive_lookups);
  session_settings::set_bool(this_00,0x804a,settings->privacy_lookups);
  session_settings::set_bool(this_00,0x804b,settings->enforce_node_id);
  session_settings::set_bool(this_00,0x804c,settings->ignore_dark_internet);
  session_settings::set_int(this_00,0x4090,settings->block_timeout);
  session_settings::set_int(this_00,0x4091,settings->block_ratelimit);
  session_settings::set_bool(this_00,0x804d,settings->read_only);
  session_settings::set_int(this_00,0x4092,settings->item_lifetime);
  session_settings::set_int(this_00,0x4052,settings->upload_rate_limit);
  session_settings::set_int(this_00,0x4093,settings->sample_infohashes_interval);
  session_settings::set_int(this_00,0x4094,settings->max_infohashes_sample_count);
  update_dht_upload_rate_limit(this);
  return;
}

Assistant:

void session_impl::set_dht_settings(dht::dht_settings const& settings)
	{
#define SET_BOOL(name) m_settings.set_bool(settings_pack::dht_ ## name, settings.name)
#define SET_INT(name) m_settings.set_int(settings_pack::dht_ ## name, settings.name)

		SET_INT(max_peers_reply);
		SET_INT(search_branching);
		SET_INT(max_fail_count);
		SET_INT(max_torrents);
		SET_INT(max_dht_items);
		SET_INT(max_peers);
		SET_INT(max_torrent_search_reply);
		SET_BOOL(restrict_routing_ips);
		SET_BOOL(restrict_search_ips);
		SET_BOOL(extended_routing_table);
		SET_BOOL(aggressive_lookups);
		SET_BOOL(privacy_lookups);
		SET_BOOL(enforce_node_id);
		SET_BOOL(ignore_dark_internet);
		SET_INT(block_timeout);
		SET_INT(block_ratelimit);
		SET_BOOL(read_only);
		SET_INT(item_lifetime);
		SET_INT(upload_rate_limit);
		SET_INT(sample_infohashes_interval);
		SET_INT(max_infohashes_sample_count);
#undef SET_BOOL
#undef SET_INT
		update_dht_upload_rate_limit();
	}